

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentation.cxx
# Opt level: O3

bool __thiscall cmDocumentation::PrintHelpOneProperty(cmDocumentation *this,ostream *os)

{
  bool bVar1;
  ostream *poVar2;
  char *in_RCX;
  cmDocumentation *this_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string_view str;
  string pname;
  undefined1 local_90 [32];
  string local_70;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_50;
  _Alloc_hider local_38;
  pointer local_30;
  undefined8 local_28;
  
  str._M_str = in_RCX;
  str._M_len = (size_t)(this->CurrentArgument)._M_dataplus._M_p;
  cmSystemTools::HelpFileName_abi_cxx11_
            (&local_70,(cmSystemTools *)(this->CurrentArgument)._M_string_length,str);
  local_50.first._M_len = 7;
  local_50.first._M_str = "prop_*/";
  local_50.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_38._M_p = (pointer)local_70._M_string_length;
  local_30 = local_70._M_dataplus._M_p;
  local_28 = 0;
  this_00 = (cmDocumentation *)local_90;
  views._M_len = 2;
  views._M_array = &local_50;
  cmCatViews((string *)this_00,views);
  bVar1 = PrintFiles(this_00,os,(string *)local_90);
  if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
    operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
  }
  if (!bVar1) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"Argument \"",10);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,(this->CurrentArgument)._M_dataplus._M_p,
                        (this->CurrentArgument)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,
               "\" to --help-property is not a CMake property.  Use --help-property-list to see all properties.\n"
               ,0x5f);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return bVar1;
}

Assistant:

bool cmDocumentation::PrintHelpOneProperty(std::ostream& os)
{
  std::string pname = cmSystemTools::HelpFileName(this->CurrentArgument);
  if (this->PrintFiles(os, cmStrCat("prop_*/", pname))) {
    return true;
  }
  // Argument was not a property.  Complain.
  os << "Argument \"" << this->CurrentArgument
     << "\" to --help-property is not a CMake property.  "
        "Use --help-property-list to see all properties.\n";
  return false;
}